

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

char * __thiscall kj::ExceptionImpl::what(ExceptionImpl *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *local_38;
  size_t local_30;
  ArrayDisposer *local_28;
  
  kj::operator*(&local_38,&this->super_Exception);
  pcVar1 = (this->whatBuffer).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->whatBuffer).content.size_;
    (this->whatBuffer).content.ptr = (char *)0x0;
    (this->whatBuffer).content.size_ = 0;
    pAVar3 = (this->whatBuffer).content.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (this->whatBuffer).content.ptr = local_38;
  (this->whatBuffer).content.size_ = local_30;
  (this->whatBuffer).content.disposer = local_28;
  if (local_30 == 0) {
    local_38 = (char *)0x0;
  }
  return local_38;
}

Assistant:

const char* ExceptionImpl::what() const noexcept {
  whatBuffer = str(*this);
  return whatBuffer.begin();
}